

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operations.c
# Opt level: O1

uint8_t SBC(uint8_t first,uint8_t second,uint8_t *flags)

{
  _Bool b;
  _Bool _Var1;
  uint8_t a;
  
  b = test_flag(*flags,Flag_Carry);
  _Var1 = half_borrow_8bit(first,second);
  if (_Var1) {
    set_flag(flags,Flag_Half_Carry);
  }
  else {
    clear_flag(flags,Flag_Half_Carry);
  }
  _Var1 = underflows_8bit(first,second);
  if (_Var1) {
    set_flag(flags,Flag_Carry);
  }
  else {
    clear_flag(flags,Flag_Carry);
  }
  a = first - second;
  _Var1 = test_flag(*flags,Flag_Half_Carry);
  if (!_Var1) {
    _Var1 = half_borrow_8bit(a,b);
    if (_Var1) {
      set_flag(flags,Flag_Half_Carry);
    }
    else {
      clear_flag(flags,Flag_Half_Carry);
    }
  }
  _Var1 = test_flag(*flags,Flag_Carry);
  if (!_Var1) {
    _Var1 = underflows_8bit(a,b);
    if (_Var1) {
      set_flag(flags,Flag_Carry);
    }
    else {
      clear_flag(flags,Flag_Carry);
    }
  }
  if ((uint8_t)(a - b) == '\0') {
    set_flag(flags,Flag_Zero);
  }
  else {
    clear_flag(flags,Flag_Zero);
  }
  set_flag(flags,Flag_Sub);
  return a - b;
}

Assistant:

uint8_t SBC(uint8_t first, uint8_t second, uint8_t* flags) {
    
    const bool carry_value = test_flag(*flags, Flag_Carry) ? 1 : 0;

    half_borrow_8bit(first, second)            ?
        set_flag(flags, Flag_Half_Carry)  :
        clear_flag(flags, Flag_Half_Carry);

    underflows_8bit(first, second)         ?
        set_flag(flags, Flag_Carry)   :
        clear_flag(flags, Flag_Carry);
    
    first = (uint8_t) (first - second);

    if(!test_flag(*flags, Flag_Half_Carry)) {
        half_borrow_8bit(first, (uint8_t) (carry_value))       ?
            set_flag(flags, Flag_Half_Carry)  :
            clear_flag(flags, Flag_Half_Carry);
    }

    if(!test_flag(*flags, Flag_Carry)) {
        underflows_8bit(first, (uint8_t) (carry_value))         ?
            set_flag(flags, Flag_Carry)   :
            clear_flag(flags, Flag_Carry);
    }

    first = (uint8_t) (first - carry_value);

    first == 0 ? set_flag(flags, Flag_Zero) : clear_flag(flags, Flag_Zero);

    set_flag(flags, Flag_Sub);

    return first;
}